

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

Llb_Grp_t * Llb_ManGroupCreate(Llb_Man_t *pMan,Aig_Obj_t *pObj)

{
  uint uVar1;
  Llb_Grp_t *pGroup;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  
  if ((pObj->field_0x18 & 0x10) == 0) {
    __assert_fail("pObj->fMarkA == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Group.c"
                  ,0xb2,"Llb_Grp_t *Llb_ManGroupCreate(Llb_Man_t *, Aig_Obj_t *)");
  }
  pGroup = Llb_ManGroupAlloc(pMan);
  pVVar3 = pGroup->vOuts;
  uVar1 = pVVar3->nCap;
  if (pVVar3->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar2;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_007c9181;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar2;
    }
    pVVar3->nCap = iVar4;
  }
LAB_007c9181:
  iVar4 = pVVar3->nSize;
  pVVar3->nSize = iVar4 + 1;
  pVVar3->pArray[iVar4] = pObj;
  Aig_ManIncrementTravId(pMan->pAig);
  uVar1 = *(uint *)&pObj->field_0x18;
  Llb_ManGroupCreate_rec
            (pMan->pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pGroup->vIns);
  if ((uVar1 & 7) != 3) {
    Llb_ManGroupCreate_rec
              (pMan->pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pGroup->vIns);
  }
  if (pGroup->vNodes == (Vec_Ptr_t *)0x0) {
    pVVar3 = Llb_ManGroupCollect(pGroup);
    pGroup->vNodes = pVVar3;
    return pGroup;
  }
  __assert_fail("p->vNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Group.c"
                ,0xbf,"Llb_Grp_t *Llb_ManGroupCreate(Llb_Man_t *, Aig_Obj_t *)");
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreate( Llb_Man_t * pMan, Aig_Obj_t * pObj )
{
    Llb_Grp_t * p;
    assert( pObj->fMarkA == 1 );
    // derive group
    p = Llb_ManGroupAlloc( pMan );
    Vec_PtrPush( p->vOuts, pObj );
    Aig_ManIncrementTravId( pMan->pAig );
    if ( Aig_ObjIsCo(pObj) )
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin0(pObj), p->vIns );
    else
    {
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin0(pObj), p->vIns );
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin1(pObj), p->vIns );
    }
    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}